

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void single_channel_8_to_bgr_555
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort *puVar3;
  int iVar4;
  
  pbVar2 = (byte *)((long)src + (long)(sy * src_pitch) + (long)sx);
  puVar3 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = iVar4;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar3 + width;
    for (; puVar3 < puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = (ushort)(*pbVar2 >> 3);
      pbVar2 = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + (src_pitch - width);
    puVar3 = puVar3 + ((long)(dst_pitch / 2) - (long)width);
  }
  return;
}

Assistant:

static void single_channel_8_to_bgr_555(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_BGR_555(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}